

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::loadModel(FastText *this,istream *in)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *this_00;
  invalid_argument *this_01;
  shared_ptr<fasttext::Matrix> *in_RSI;
  long in_RDI;
  bool quant_input;
  istream *in_stack_ffffffffffffff58;
  Args *in_stack_ffffffffffffff60;
  shared_ptr<fasttext::Matrix> *this_02;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffff80;
  shared_ptr<fasttext::Args> *in_stack_ffffffffffffff88;
  FastText *in_stack_ffffffffffffffa0;
  byte local_51 [65];
  shared_ptr<fasttext::Matrix> *local_10;
  
  local_10 = in_RSI;
  std::make_shared<fasttext::Args>();
  std::shared_ptr<fasttext::Args>::operator=
            ((shared_ptr<fasttext::Args> *)in_stack_ffffffffffffff60,
             (shared_ptr<fasttext::Args> *)in_stack_ffffffffffffff58);
  std::shared_ptr<fasttext::Args>::~shared_ptr((shared_ptr<fasttext::Args> *)0x1b9820);
  std::make_shared<fasttext::DenseMatrix>();
  std::shared_ptr<fasttext::Matrix>::operator=
            ((shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff60,
             (shared_ptr<fasttext::DenseMatrix> *)in_stack_ffffffffffffff58);
  std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr((shared_ptr<fasttext::DenseMatrix> *)0x1b9847)
  ;
  std::make_shared<fasttext::DenseMatrix>();
  std::shared_ptr<fasttext::Matrix>::operator=
            ((shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff60,
             (shared_ptr<fasttext::DenseMatrix> *)in_stack_ffffffffffffff58);
  std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr((shared_ptr<fasttext::DenseMatrix> *)0x1b986e)
  ;
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b9878);
  Args::load(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if ((*(int *)(in_RDI + 0x6c) == 0xb) &&
     (peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b989d), peVar2->model == sup)) {
    peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b98b0);
    peVar2->maxn = 0;
  }
  std::make_shared<fasttext::Dictionary,std::shared_ptr<fasttext::Args>&,std::istream&>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::shared_ptr<fasttext::Dictionary>::operator=
            ((shared_ptr<fasttext::Dictionary> *)in_stack_ffffffffffffff60,
             (shared_ptr<fasttext::Dictionary> *)in_stack_ffffffffffffff58);
  std::shared_ptr<fasttext::Dictionary>::~shared_ptr((shared_ptr<fasttext::Dictionary> *)0x1b98ee);
  std::istream::read((char *)local_10,(long)local_51);
  if ((local_51[0] & 1) != 0) {
    *(undefined1 *)(in_RDI + 0x68) = 1;
    std::make_shared<fasttext::QuantMatrix>();
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff60,
               (shared_ptr<fasttext::QuantMatrix> *)in_stack_ffffffffffffff58);
    std::shared_ptr<fasttext::QuantMatrix>::~shared_ptr
              ((shared_ptr<fasttext::QuantMatrix> *)0x1b993c);
  }
  peVar3 = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b994a);
  (*peVar3->_vptr_Matrix[8])(peVar3,local_10);
  if ((local_51[0] & 1) == 0) {
    this_00 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b9970);
    bVar1 = Dictionary::isPruned(this_00);
    if (bVar1) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_01,
                 "Invalid model file.\nPlease download the updated model from www.fasttext.cc.\nSee issue #332 on Github for more information.\n"
                );
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  this_02 = local_10;
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b99ed);
  std::istream::read((char *)this_02,(long)&peVar2->qout);
  if (((*(byte *)(in_RDI + 0x68) & 1) != 0) &&
     (peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b9a1b), (peVar2->qout & 1U) != 0)) {
    std::make_shared<fasttext::QuantMatrix>();
    std::shared_ptr<fasttext::Matrix>::operator=
              (this_02,(shared_ptr<fasttext::QuantMatrix> *)in_stack_ffffffffffffff58);
    std::shared_ptr<fasttext::QuantMatrix>::~shared_ptr
              ((shared_ptr<fasttext::QuantMatrix> *)0x1b9a4b);
  }
  peVar3 = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b9a59);
  (*peVar3->_vptr_Matrix[8])(peVar3,local_10);
  buildModel(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void FastText::loadModel(std::istream& in) {
  args_ = std::make_shared<Args>();
  input_ = std::make_shared<DenseMatrix>();
  output_ = std::make_shared<DenseMatrix>();
  args_->load(in);
  if (version == 11 && args_->model == model_name::sup) {
    // backward compatibility: old supervised models do not use char ngrams.
    args_->maxn = 0;
  }
  dict_ = std::make_shared<Dictionary>(args_, in);

  bool quant_input;
  in.read((char*)&quant_input, sizeof(bool));
  if (quant_input) {
    quant_ = true;
    input_ = std::make_shared<QuantMatrix>();
  }
  input_->load(in);

  if (!quant_input && dict_->isPruned()) {
    throw std::invalid_argument(
        "Invalid model file.\n"
        "Please download the updated model from www.fasttext.cc.\n"
        "See issue #332 on Github for more information.\n");
  }

  in.read((char*)&args_->qout, sizeof(bool));
  if (quant_ && args_->qout) {
    output_ = std::make_shared<QuantMatrix>();
  }
  output_->load(in);

  buildModel();
}